

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8)

{
  bool bVar1;
  uint local_50;
  uint uStack_4c;
  OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  RegSlot R3_local;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  layout.R7 = R3;
  layout.R8 = R2;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&local_50,R0);
  if ((((((bVar1) &&
         (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&uStack_4c,R1), bVar1))
        && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R0,layout.R8),
           bVar1)) &&
       ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R1,layout.R7),
        bVar1 && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R2,R4),
                 bVar1)))) &&
      ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R3,R5), bVar1 &&
       ((bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R4,R6), bVar1 &&
        (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R5,R7), bVar1))))
      )) && (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&layout.R6,R8), bVar1
            )) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_50,0x24,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg9(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8)
    {
        OpLayoutT_AsmReg9<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) &&
            SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6) && SizePolicy::Assign(layout.R7, R7) && SizePolicy::Assign(layout.R8, R8))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }